

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::CodeGeneratorRequest::MergeFrom
          (CodeGeneratorRequest *this,CodeGeneratorRequest *from)

{
  uint uVar1;
  void *pvVar2;
  string *initial_value;
  string *psVar3;
  LogMessage *other;
  Version *pVVar4;
  LogFinisher local_59;
  LogMessage local_58;
  
  if (from == this) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/plugin.pb.cc"
               ,0x43b);
    other = internal::LogMessage::operator<<(&local_58,"CHECK failed: (&from) != (this): ");
    internal::LogFinisher::operator=(&local_59,other);
    internal::LogMessage::~LogMessage(&local_58);
  }
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,(UnknownFieldSet *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            (&(this->file_to_generate_).super_RepeatedPtrFieldBase,
             &(from->file_to_generate_).super_RepeatedPtrFieldBase);
  internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<google::protobuf::FileDescriptorProto>::TypeHandler>
            (&(this->proto_file_).super_RepeatedPtrFieldBase,
             &(from->proto_file_).super_RepeatedPtrFieldBase);
  uVar1 = (from->_has_bits_).has_bits_[0];
  if ((uVar1 & 3) != 0) {
    if ((uVar1 & 1) != 0) {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
      initial_value = (from->parameter_).ptr_;
      psVar3 = (this->parameter_).ptr_;
      if (psVar3 != initial_value) {
        if (psVar3 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
          internal::ArenaStringPtr::CreateInstanceNoArena(&this->parameter_,initial_value);
        }
        else {
          std::__cxx11::string::_M_assign((string *)psVar3);
        }
      }
    }
    if ((uVar1 & 2) != 0) {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
      if (this->compiler_version_ == (Version *)0x0) {
        pVVar4 = (Version *)operator_new(0x30);
        Version::Version(pVVar4);
        this->compiler_version_ = pVVar4;
      }
      pVVar4 = (Version *)&_Version_default_instance_;
      if (from->compiler_version_ != (Version *)0x0) {
        pVVar4 = from->compiler_version_;
      }
      Version::MergeFrom(this->compiler_version_,pVVar4);
    }
  }
  return;
}

Assistant:

void CodeGeneratorRequest::MergeFrom(const CodeGeneratorRequest& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.compiler.CodeGeneratorRequest)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  file_to_generate_.MergeFrom(from.file_to_generate_);
  proto_file_.MergeFrom(from.proto_file_);
  cached_has_bits = from._has_bits_[0];
  if (cached_has_bits & 3u) {
    if (cached_has_bits & 0x00000001u) {
      set_has_parameter();
      parameter_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.parameter_);
    }
    if (cached_has_bits & 0x00000002u) {
      mutable_compiler_version()->::google::protobuf::compiler::Version::MergeFrom(from.compiler_version());
    }
  }
}